

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t encoder_base64_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  mime_encoder_state *pmVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  char *local_48;
  char *ptr;
  size_t sStack_38;
  int i;
  size_t cursize;
  mime_encoder_state *st;
  curl_mimepart *part_local;
  size_t sStack_18;
  _Bool ateof_local;
  size_t size_local;
  char *buffer_local;
  
  pmVar4 = &part->encstate;
  sStack_38 = 0;
  local_48 = buffer;
  sStack_18 = size;
  while ((part->encstate).bufbeg < (part->encstate).bufend) {
    if (0x48 < pmVar4->pos) {
      if (sStack_18 < 2) break;
      pcVar7 = local_48 + 1;
      *local_48 = '\r';
      local_48 = local_48 + 2;
      *pcVar7 = '\n';
      pmVar4->pos = 0;
      sStack_38 = sStack_38 + 2;
      sStack_18 = sStack_18 - 2;
    }
    if ((sStack_18 < 4) || ((part->encstate).bufend - (part->encstate).bufbeg < 3)) break;
    sVar6 = (part->encstate).bufbeg;
    (part->encstate).bufbeg = sVar6 + 1;
    cVar1 = (part->encstate).buf[sVar6];
    sVar6 = (part->encstate).bufbeg;
    (part->encstate).bufbeg = sVar6 + 1;
    cVar2 = (part->encstate).buf[sVar6];
    sVar6 = (part->encstate).bufbeg;
    (part->encstate).bufbeg = sVar6 + 1;
    uVar3 = (uint)CONCAT21(CONCAT11(cVar1,cVar2),(part->encstate).buf[sVar6]);
    *local_48 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(int)uVar3 >> 0x12];
    local_48[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((int)uVar3 >> 0xc & 0x3f)];
    pcVar7 = local_48 + 3;
    local_48[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((int)uVar3 >> 6 & 0x3f)];
    local_48 = local_48 + 4;
    *pcVar7 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(int)(uVar3 & 0x3f)];
    sStack_38 = sStack_38 + 4;
    pmVar4->pos = pmVar4->pos + 4;
    sStack_18 = sStack_18 - 4;
  }
  if ((ateof) && (3 < sStack_18)) {
    local_48[3] = '=';
    local_48[2] = '=';
    ptr._4_4_ = 0;
    lVar5 = (part->encstate).bufend - (part->encstate).bufbeg;
    if (lVar5 != 1) {
      if (lVar5 != 2) {
        return sStack_38;
      }
      ptr._4_4_ = (uint)(byte)(part->encstate).buf[(part->encstate).bufbeg + 1] << 8;
    }
    uVar3 = (uint)(byte)(part->encstate).buf[(part->encstate).bufbeg] << 0x10 | ptr._4_4_;
    *local_48 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(int)uVar3 >> 0x12];
    local_48[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)((int)uVar3 >> 0xc & 0x3f)];
    sVar6 = (part->encstate).bufbeg + 1;
    (part->encstate).bufbeg = sVar6;
    if (sVar6 != (part->encstate).bufend) {
      local_48[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)((int)uVar3 >> 6 & 0x3f)];
      (part->encstate).bufbeg = (part->encstate).bufbeg + 1;
    }
    sStack_38 = sStack_38 + 4;
    pmVar4->pos = pmVar4->pos + 4;
  }
  return sStack_38;
}

Assistant:

static size_t encoder_base64_read(char *buffer, size_t size, bool ateof,
                                curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  size_t cursize = 0;
  int i;
  char *ptr = buffer;

  while(st->bufbeg < st->bufend) {
    /* Line full ? */
    if(st->pos > MAX_ENCODED_LINE_LENGTH - 4) {
      /* Yes, we need 2 characters for CRLF. */
      if(size < 2)
        break;
      *ptr++ = '\r';
      *ptr++ = '\n';
      st->pos = 0;
      cursize += 2;
      size -= 2;
    }

    /* Be sure there is enough space and input data for a base64 group. */
    if(size < 4 || st->bufend - st->bufbeg < 3)
      break;

    /* Encode three bytes as four characters. */
    i = st->buf[st->bufbeg++] & 0xFF;
    i = (i << 8) | (st->buf[st->bufbeg++] & 0xFF);
    i = (i << 8) | (st->buf[st->bufbeg++] & 0xFF);
    *ptr++ = base64[(i >> 18) & 0x3F];
    *ptr++ = base64[(i >> 12) & 0x3F];
    *ptr++ = base64[(i >> 6) & 0x3F];
    *ptr++ = base64[i & 0x3F];
    cursize += 4;
    st->pos += 4;
    size -= 4;
  }

  /* If at eof, we have to flush the buffered data. */
  if(ateof && size >= 4) {
    /* Buffered data size can only be 0, 1 or 2. */
    ptr[2] = ptr[3] = '=';
    i = 0;
    switch(st->bufend - st->bufbeg) {
    case 2:
      i = (st->buf[st->bufbeg + 1] & 0xFF) << 8;
      /* FALLTHROUGH */
    case 1:
      i |= (st->buf[st->bufbeg] & 0xFF) << 16;
      ptr[0] = base64[(i >> 18) & 0x3F];
      ptr[1] = base64[(i >> 12) & 0x3F];
      if(++st->bufbeg != st->bufend) {
        ptr[2] = base64[(i >> 6) & 0x3F];
        st->bufbeg++;
      }
      cursize += 4;
      st->pos += 4;
      break;
    }
  }

#ifdef CURL_DOES_CONVERSIONS
  /* This is now textual data, Convert character codes. */
  if(part->easy && cursize) {
    CURLcode result = Curl_convert_to_network(part->easy, buffer, cursize);
    if(result)
      return READ_ERROR;
  }
#endif

  return cursize;
}